

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMinkowskiPenetrationDepthSolver.cpp
# Opt level: O0

btVector3 * btMinkowskiPenetrationDepthSolver::getPenetrationDirections(void)

{
  int iVar1;
  btVector3 *local_210;
  btScalar local_208;
  btScalar local_204;
  btScalar local_200;
  btScalar local_1fc;
  btScalar local_1f8;
  btScalar local_1f4;
  btScalar local_1f0;
  btScalar local_1ec;
  btScalar local_1e8;
  btScalar local_1e4;
  btScalar local_1e0;
  btScalar local_1dc;
  btScalar local_1d8;
  btScalar local_1d4;
  btScalar local_1d0;
  btScalar local_1cc;
  btScalar local_1c8;
  btScalar local_1c4;
  btScalar local_1c0;
  btScalar local_1bc;
  btScalar local_1b8;
  btScalar local_1b4;
  btScalar local_1b0;
  btScalar local_1ac;
  btScalar local_1a8;
  btScalar local_1a4;
  btScalar local_1a0;
  btScalar local_19c;
  btScalar local_198;
  btScalar local_194;
  btScalar local_190;
  btScalar local_18c;
  btScalar local_188;
  btScalar local_184;
  btScalar local_180;
  btScalar local_17c;
  btScalar local_178;
  btScalar local_174;
  btScalar local_170;
  btScalar local_16c;
  btScalar local_168;
  btScalar local_164;
  btScalar local_160;
  btScalar local_15c;
  btScalar local_158;
  btScalar local_154;
  btScalar local_150;
  btScalar local_14c;
  btScalar local_148;
  btScalar local_144;
  btScalar local_140;
  btScalar local_13c;
  btScalar local_138;
  btScalar local_134;
  btScalar local_130;
  btScalar local_12c;
  btScalar local_128;
  btScalar local_124;
  btScalar local_120;
  btScalar local_11c;
  btScalar local_118;
  btScalar local_114;
  btScalar local_110;
  btScalar local_10c;
  btScalar local_108;
  btScalar local_104;
  btScalar local_100;
  btScalar local_fc;
  btScalar local_f8;
  btScalar local_f4;
  btScalar local_f0;
  btScalar local_ec;
  btScalar local_e8;
  btScalar local_e4;
  btScalar local_e0;
  btScalar local_dc;
  btScalar local_d8;
  btScalar local_d4;
  btScalar local_d0;
  btScalar local_cc;
  btScalar local_c8;
  btScalar local_c4;
  btScalar local_c0;
  btScalar local_bc;
  btScalar local_b8;
  btScalar local_b4;
  btScalar local_b0;
  btScalar local_ac;
  btScalar local_a8;
  btScalar local_a4;
  btScalar local_a0;
  btScalar local_9c;
  btScalar local_98;
  btScalar local_94;
  btScalar local_90;
  btScalar local_8c;
  btScalar local_88;
  btScalar local_84;
  btScalar local_80;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btScalar local_68;
  btScalar local_64;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28;
  btScalar local_24;
  btScalar local_20 [5];
  btScalar local_c;
  btScalar local_8;
  btScalar local_4;
  
  if (getPenetrationDirections()::sPenetrationDirections == '\0') {
    iVar1 = __cxa_guard_acquire(&getPenetrationDirections()::sPenetrationDirections);
    if (iVar1 != 0) {
      local_4 = 0.0;
      local_8 = -0.0;
      local_c = -1.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections,&local_4,&local_8,&local_c);
      local_20[0] = 0.723608;
      local_24 = -0.525725;
      local_28 = -0.447219;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 1,local_20,&local_24,&local_28);
      local_2c = -0.276388;
      local_30 = -0.850649;
      local_34 = -0.447219;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 2,&local_2c,&local_30,&local_34)
      ;
      local_38 = -0.894426;
      local_3c = -0.0;
      local_40 = -0.447216;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 3,&local_38,&local_3c,&local_40)
      ;
      local_44 = -0.276388;
      local_48 = 0.850649;
      local_4c = -0.44722;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 4,&local_44,&local_48,&local_4c)
      ;
      local_50 = 0.723608;
      local_54 = 0.525725;
      local_58 = -0.447219;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 5,&local_50,&local_54,&local_58)
      ;
      local_5c = 0.276388;
      local_60 = -0.850649;
      local_64 = 0.44722;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 6,&local_5c,&local_60,&local_64)
      ;
      local_68 = -0.723608;
      local_6c = -0.525725;
      local_70 = 0.447219;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 7,&local_68,&local_6c,&local_70)
      ;
      local_74 = -0.723608;
      local_78 = 0.525725;
      local_7c = 0.447219;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 8,&local_74,&local_78,&local_7c)
      ;
      local_80 = 0.276388;
      local_84 = 0.850649;
      local_88 = 0.447219;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 9,&local_80,&local_84,&local_88)
      ;
      local_8c = 0.894426;
      local_90 = 0.0;
      local_94 = 0.447216;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 10,&local_8c,&local_90,&local_94
                );
      local_98 = -0.0;
      local_9c = 0.0;
      local_a0 = 1.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0xb,&local_98,&local_9c,
                 &local_a0);
      local_a4 = 0.425323;
      local_a8 = -0.309011;
      local_ac = -0.850654;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0xc,&local_a4,&local_a8,
                 &local_ac);
      local_b0 = -0.162456;
      local_b4 = -0.499995;
      local_b8 = -0.850654;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0xd,&local_b0,&local_b4,
                 &local_b8);
      local_bc = 0.262869;
      local_c0 = -0.809012;
      local_c4 = -0.525738;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0xe,&local_bc,&local_c0,
                 &local_c4);
      local_c8 = 0.425323;
      local_cc = 0.309011;
      local_d0 = -0.850654;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0xf,&local_c8,&local_cc,
                 &local_d0);
      local_d4 = 0.850648;
      local_d8 = -0.0;
      local_dc = -0.525736;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x10,&local_d4,&local_d8,
                 &local_dc);
      local_e0 = -0.52573;
      local_e4 = -0.0;
      local_e8 = -0.850652;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x11,&local_e0,&local_e4,
                 &local_e8);
      local_ec = -0.68819;
      local_f0 = -0.499997;
      local_f4 = -0.525736;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x12,&local_ec,&local_f0,
                 &local_f4);
      local_f8 = -0.162456;
      local_fc = 0.499995;
      local_100 = -0.850654;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x13,&local_f8,&local_fc,
                 &local_100);
      local_104 = -0.68819;
      local_108 = 0.499997;
      local_10c = -0.525736;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x14,&local_104,&local_108,
                 &local_10c);
      local_110 = 0.262869;
      local_114 = 0.809012;
      local_118 = -0.525738;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x15,&local_110,&local_114,
                 &local_118);
      local_11c = 0.951058;
      local_120 = 0.309013;
      local_124 = 0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x16,&local_11c,&local_120,
                 &local_124);
      local_128 = 0.951058;
      local_12c = -0.309013;
      local_130 = 0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x17,&local_128,&local_12c,
                 &local_130);
      local_134 = 0.587786;
      local_138 = -0.809017;
      local_13c = 0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x18,&local_134,&local_138,
                 &local_13c);
      local_140 = 0.0;
      local_144 = -1.0;
      local_148 = 0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x19,&local_140,&local_144,
                 &local_148);
      local_14c = -0.587786;
      local_150 = -0.809017;
      local_154 = 0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x1a,&local_14c,&local_150,
                 &local_154);
      local_158 = -0.951058;
      local_15c = -0.309013;
      local_160 = -0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x1b,&local_158,&local_15c,
                 &local_160);
      local_164 = -0.951058;
      local_168 = 0.309013;
      local_16c = -0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x1c,&local_164,&local_168,
                 &local_16c);
      local_170 = -0.587786;
      local_174 = 0.809017;
      local_178 = -0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x1d,&local_170,&local_174,
                 &local_178);
      local_17c = -0.0;
      local_180 = 1.0;
      local_184 = -0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x1e,&local_17c,&local_180,
                 &local_184);
      local_188 = 0.587786;
      local_18c = 0.809017;
      local_190 = -0.0;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x1f,&local_188,&local_18c,
                 &local_190);
      local_194 = 0.68819;
      local_198 = -0.499997;
      local_19c = 0.525736;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x20,&local_194,&local_198,
                 &local_19c);
      local_1a0 = -0.262869;
      local_1a4 = -0.809012;
      local_1a8 = 0.525738;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x21,&local_1a0,&local_1a4,
                 &local_1a8);
      local_1ac = -0.850648;
      local_1b0 = 0.0;
      local_1b4 = 0.525736;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x22,&local_1ac,&local_1b0,
                 &local_1b4);
      local_1b8 = -0.262869;
      local_1bc = 0.809012;
      local_1c0 = 0.525738;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x23,&local_1b8,&local_1bc,
                 &local_1c0);
      local_1c4 = 0.68819;
      local_1c8 = 0.499997;
      local_1cc = 0.525736;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x24,&local_1c4,&local_1c8,
                 &local_1cc);
      local_1d0 = 0.52573;
      local_1d4 = 0.0;
      local_1d8 = 0.850652;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x25,&local_1d0,&local_1d4,
                 &local_1d8);
      local_1dc = 0.162456;
      local_1e0 = -0.499995;
      local_1e4 = 0.850654;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x26,&local_1dc,&local_1e0,
                 &local_1e4);
      local_1e8 = -0.425323;
      local_1ec = -0.309011;
      local_1f0 = 0.850654;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x27,&local_1e8,&local_1ec,
                 &local_1f0);
      local_1f4 = -0.425323;
      local_1f8 = 0.309011;
      local_1fc = 0.850654;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x28,&local_1f4,&local_1f8,
                 &local_1fc);
      local_200 = 0.162456;
      local_204 = 0.499995;
      local_208 = 0.850654;
      btVector3::btVector3
                (getPenetrationDirections::sPenetrationDirections + 0x29,&local_200,&local_204,
                 &local_208);
      local_210 = getPenetrationDirections::sPenetrationDirections + 0x2a;
      do {
        btVector3::btVector3(local_210);
        local_210 = local_210 + 1;
      } while (local_210 != (btVector3 *)&getPenetrationDirections()::sPenetrationDirections);
      __cxa_guard_release(&getPenetrationDirections()::sPenetrationDirections);
    }
  }
  return getPenetrationDirections::sPenetrationDirections;
}

Assistant:

btVector3*	btMinkowskiPenetrationDepthSolver::getPenetrationDirections()
{
	static btVector3	sPenetrationDirections[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2] = 
	{
	btVector3(btScalar(0.000000) , btScalar(-0.000000),btScalar(-1.000000)),
	btVector3(btScalar(0.723608) , btScalar(-0.525725),btScalar(-0.447219)),
	btVector3(btScalar(-0.276388) , btScalar(-0.850649),btScalar(-0.447219)),
	btVector3(btScalar(-0.894426) , btScalar(-0.000000),btScalar(-0.447216)),
	btVector3(btScalar(-0.276388) , btScalar(0.850649),btScalar(-0.447220)),
	btVector3(btScalar(0.723608) , btScalar(0.525725),btScalar(-0.447219)),
	btVector3(btScalar(0.276388) , btScalar(-0.850649),btScalar(0.447220)),
	btVector3(btScalar(-0.723608) , btScalar(-0.525725),btScalar(0.447219)),
	btVector3(btScalar(-0.723608) , btScalar(0.525725),btScalar(0.447219)),
	btVector3(btScalar(0.276388) , btScalar(0.850649),btScalar(0.447219)),
	btVector3(btScalar(0.894426) , btScalar(0.000000),btScalar(0.447216)),
	btVector3(btScalar(-0.000000) , btScalar(0.000000),btScalar(1.000000)),
	btVector3(btScalar(0.425323) , btScalar(-0.309011),btScalar(-0.850654)),
	btVector3(btScalar(-0.162456) , btScalar(-0.499995),btScalar(-0.850654)),
	btVector3(btScalar(0.262869) , btScalar(-0.809012),btScalar(-0.525738)),
	btVector3(btScalar(0.425323) , btScalar(0.309011),btScalar(-0.850654)),
	btVector3(btScalar(0.850648) , btScalar(-0.000000),btScalar(-0.525736)),
	btVector3(btScalar(-0.525730) , btScalar(-0.000000),btScalar(-0.850652)),
	btVector3(btScalar(-0.688190) , btScalar(-0.499997),btScalar(-0.525736)),
	btVector3(btScalar(-0.162456) , btScalar(0.499995),btScalar(-0.850654)),
	btVector3(btScalar(-0.688190) , btScalar(0.499997),btScalar(-0.525736)),
	btVector3(btScalar(0.262869) , btScalar(0.809012),btScalar(-0.525738)),
	btVector3(btScalar(0.951058) , btScalar(0.309013),btScalar(0.000000)),
	btVector3(btScalar(0.951058) , btScalar(-0.309013),btScalar(0.000000)),
	btVector3(btScalar(0.587786) , btScalar(-0.809017),btScalar(0.000000)),
	btVector3(btScalar(0.000000) , btScalar(-1.000000),btScalar(0.000000)),
	btVector3(btScalar(-0.587786) , btScalar(-0.809017),btScalar(0.000000)),
	btVector3(btScalar(-0.951058) , btScalar(-0.309013),btScalar(-0.000000)),
	btVector3(btScalar(-0.951058) , btScalar(0.309013),btScalar(-0.000000)),
	btVector3(btScalar(-0.587786) , btScalar(0.809017),btScalar(-0.000000)),
	btVector3(btScalar(-0.000000) , btScalar(1.000000),btScalar(-0.000000)),
	btVector3(btScalar(0.587786) , btScalar(0.809017),btScalar(-0.000000)),
	btVector3(btScalar(0.688190) , btScalar(-0.499997),btScalar(0.525736)),
	btVector3(btScalar(-0.262869) , btScalar(-0.809012),btScalar(0.525738)),
	btVector3(btScalar(-0.850648) , btScalar(0.000000),btScalar(0.525736)),
	btVector3(btScalar(-0.262869) , btScalar(0.809012),btScalar(0.525738)),
	btVector3(btScalar(0.688190) , btScalar(0.499997),btScalar(0.525736)),
	btVector3(btScalar(0.525730) , btScalar(0.000000),btScalar(0.850652)),
	btVector3(btScalar(0.162456) , btScalar(-0.499995),btScalar(0.850654)),
	btVector3(btScalar(-0.425323) , btScalar(-0.309011),btScalar(0.850654)),
	btVector3(btScalar(-0.425323) , btScalar(0.309011),btScalar(0.850654)),
	btVector3(btScalar(0.162456) , btScalar(0.499995),btScalar(0.850654))
	};

	return sPenetrationDirections;
}